

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

RPCHelpMan * wallet::importwallet(void)

{
  string name;
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  Fallback fallback;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_01;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffa90;
  _Manager_type in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffaa8;
  pointer in_stack_fffffffffffffab8;
  pointer pRVar1;
  pointer in_stack_fffffffffffffac0;
  pointer pRVar2;
  pointer in_stack_fffffffffffffac8;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffae8 [16];
  pointer in_stack_fffffffffffffaf8;
  pointer in_stack_fffffffffffffb00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb18 [16];
  undefined1 in_stack_fffffffffffffb28 [56];
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  char *local_328;
  size_type local_320;
  char local_318 [8];
  undefined8 uStack_310;
  string local_308 [32];
  string local_2e8 [32];
  RPCResult local_2c8;
  RPCArgOptions local_240;
  string local_1f8 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1d8;
  undefined1 local_180;
  string local_178 [32];
  RPCArg local_158;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"importwallet",(allocator<char> *)&stack0xfffffffffffffb17);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,
             "\nImports keys from a wallet dump file (see dumpwallet). Requires a new wallet backup to include imported keys.\nNote: Blockchain and Mempool will be rescanned after a successful import. Use \"getwalletinfo\" to query the scanning progress.\nNote: This command is only compatible with legacy wallets.\n"
             ,(allocator<char> *)&stack0xfffffffffffffb16);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178,"filename",(allocator<char> *)&stack0xfffffffffffffaf7);
  local_1d8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_180 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"The wallet file",(allocator<char> *)&stack0xfffffffffffffaf6);
  local_240.oneline_description._M_dataplus._M_p = (pointer)&local_240.oneline_description.field_2;
  local_240.skip_type_check = false;
  local_240.oneline_description._M_string_length = 0;
  local_240.oneline_description.field_2._M_local_buf[0] = '\0';
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_240.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_240._58_8_ = 0;
  name._M_string_length = in_stack_fffffffffffffa80;
  name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa78;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffffa88;
  name.field_2._8_8_ = in_stack_fffffffffffffa90;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffffaa0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffffa98;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffffaa8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffffab8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffffac0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffffac8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffffad0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffffad0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffffad0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffffae8;
  description_01._M_string_length = (size_type)in_stack_fffffffffffffb00;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffaf8;
  description_01.field_2 = in_stack_fffffffffffffb08;
  opts.oneline_description._M_string_length = in_stack_fffffffffffffb28._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffb28._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffb28._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffffb28[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffffb28[0x31];
  opts._66_6_ = in_stack_fffffffffffffb28._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffffb18[0];
  opts._1_7_ = in_stack_fffffffffffffb18._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb18._8_8_;
  RPCArg::RPCArg(&local_158,name,(Type)local_178,fallback,description_01,opts);
  __l._M_len = 1;
  __l._M_array = &local_158;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffaf8,__l,
             (allocator_type *)&stack0xfffffffffffffaf5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"",(allocator<char> *)&stack0xfffffffffffffad7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_308,"",(allocator<char> *)&stack0xfffffffffffffad6);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffa80;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa78;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa88;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffa90;
  description._M_string_length = in_stack_fffffffffffffaa0;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa98;
  description.field_2 = in_stack_fffffffffffffaa8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_2c8,NONE,m_key_name,description,inner,SUB81(local_2e8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa80;
  result._0_8_ = in_stack_fffffffffffffa78;
  result.m_key_name._M_string_length = in_stack_fffffffffffffa88;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffa90;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffa98;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffaa0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffaa8;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffad0;
  result.m_cond._8_16_ = in_stack_fffffffffffffae8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffffaf8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffad8,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"dumpwallet",(allocator<char> *)&stack0xfffffffffffffab7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"\"test\"",(allocator<char> *)&stack0xfffffffffffffab6);
  HelpExampleCli(&local_3e8,&local_408,&local_428);
  std::operator+(&local_3c8,"\nDump the wallet\n",&local_3e8);
  std::operator+(&local_3a8,&local_3c8,"\nImport the wallet\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"importwallet",(allocator<char> *)&stack0xfffffffffffffab5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_488,"\"test\"",(allocator<char> *)&stack0xfffffffffffffab4);
  HelpExampleCli(&local_448,&local_468,&local_488);
  std::operator+(&local_388,&local_3a8,&local_448);
  std::operator+(&local_368,&local_388,"\nImport using the json rpc call\n");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb38,"importwallet",
             (allocator<char> *)&stack0xfffffffffffffab3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffb18,"\"test\"",
             (allocator<char> *)&stack0xfffffffffffffab2);
  HelpExampleRpc((string *)&stack0xfffffffffffffb58,(string *)&stack0xfffffffffffffb38,
                 (string *)&stack0xfffffffffffffb18);
  std::operator+(&local_348,&local_368,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffb58);
  local_328 = local_318;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p == &local_348.field_2) {
    uStack_310 = local_348.field_2._8_8_;
  }
  else {
    local_328 = local_348._M_dataplus._M_p;
  }
  local_320 = local_348._M_string_length;
  local_348._M_string_length = 0;
  local_348.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp:506:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/backup.cpp:506:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffaa8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffaf8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffae8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffae8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffffb00;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffffb18._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffffb18._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffffb08._M_local_buf;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffa80,&stack0xfffffffffffffa88)),
             description_00,args,(RPCResults)in_stack_fffffffffffffad0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffa88);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb58);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb38);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_408);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffad8);
  RPCResult::~RPCResult(&local_2c8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffab8);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffaf8);
  RPCArg::~RPCArg(&local_158);
  RPCArgOptions::~RPCArgOptions(&local_240);
  std::__cxx11::string::~string(local_1f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1d8._M_first);
  std::__cxx11::string::~string(local_178);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan importwallet()
{
    return RPCHelpMan{"importwallet",
                "\nImports keys from a wallet dump file (see dumpwallet). Requires a new wallet backup to include imported keys.\n"
                "Note: Blockchain and Mempool will be rescanned after a successful import. Use \"getwalletinfo\" to query the scanning progress.\n"
                "Note: This command is only compatible with legacy wallets.\n",
                {
                    {"filename", RPCArg::Type::STR, RPCArg::Optional::NO, "The wallet file"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
            "\nDump the wallet\n"
            + HelpExampleCli("dumpwallet", "\"test\"") +
            "\nImport the wallet\n"
            + HelpExampleCli("importwallet", "\"test\"") +
            "\nImport using the json rpc call\n"
            + HelpExampleRpc("importwallet", "\"test\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    EnsureLegacyScriptPubKeyMan(*pwallet, true);

    WalletRescanReserver reserver(*pwallet);
    if (!reserver.reserve()) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
    }

    int64_t nTimeBegin = 0;
    bool fGood = true;
    {
        LOCK(pwallet->cs_wallet);

        EnsureWalletIsUnlocked(*pwallet);

        std::ifstream file;
        file.open(fs::u8path(request.params[0].get_str()), std::ios::in | std::ios::ate);
        if (!file.is_open()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Cannot open wallet dump file");
        }
        CHECK_NONFATAL(pwallet->chain().findBlock(pwallet->GetLastBlockHash(), FoundBlock().time(nTimeBegin)));

        int64_t nFilesize = std::max((int64_t)1, (int64_t)file.tellg());
        file.seekg(0, file.beg);

        // Use uiInterface.ShowProgress instead of pwallet.ShowProgress because pwallet.ShowProgress has a cancel button tied to AbortRescan which
        // we don't want for this progress bar showing the import progress. uiInterface.ShowProgress does not have a cancel button.
        pwallet->chain().showProgress(strprintf("%s " + _("Importing…").translated, pwallet->GetDisplayName()), 0, false); // show progress dialog in GUI
        std::vector<std::tuple<CKey, int64_t, bool, std::string>> keys;
        std::vector<std::pair<CScript, int64_t>> scripts;
        while (file.good()) {
            pwallet->chain().showProgress("", std::max(1, std::min(50, (int)(((double)file.tellg() / (double)nFilesize) * 100))), false);
            std::string line;
            std::getline(file, line);
            if (line.empty() || line[0] == '#')
                continue;

            std::vector<std::string> vstr = SplitString(line, ' ');
            if (vstr.size() < 2)
                continue;
            CKey key = DecodeSecret(vstr[0]);
            if (key.IsValid()) {
                int64_t nTime = ParseISO8601DateTime(vstr[1]);
                std::string strLabel;
                bool fLabel = true;
                for (unsigned int nStr = 2; nStr < vstr.size(); nStr++) {
                    if (vstr[nStr].front() == '#')
                        break;
                    if (vstr[nStr] == "change=1")
                        fLabel = false;
                    if (vstr[nStr] == "reserve=1")
                        fLabel = false;
                    if (vstr[nStr].substr(0,6) == "label=") {
                        strLabel = DecodeDumpString(vstr[nStr].substr(6));
                        fLabel = true;
                    }
                }
                nTimeBegin = std::min(nTimeBegin, nTime);
                keys.emplace_back(key, nTime, fLabel, strLabel);
            } else if(IsHex(vstr[0])) {
                std::vector<unsigned char> vData(ParseHex(vstr[0]));
                CScript script = CScript(vData.begin(), vData.end());
                int64_t birth_time = ParseISO8601DateTime(vstr[1]);
                if (birth_time > 0) nTimeBegin = std::min(nTimeBegin, birth_time);
                scripts.emplace_back(script, birth_time);
            }
        }
        file.close();
        EnsureBlockDataFromTime(*pwallet, nTimeBegin);
        // We now know whether we are importing private keys, so we can error if private keys are disabled
        if (keys.size() > 0 && pwallet->IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
            pwallet->chain().showProgress("", 100, false); // hide progress dialog in GUI
            throw JSONRPCError(RPC_WALLET_ERROR, "Importing wallets is disabled when private keys are disabled");
        }
        double total = (double)(keys.size() + scripts.size());
        double progress = 0;
        for (const auto& key_tuple : keys) {
            pwallet->chain().showProgress("", std::max(50, std::min(75, (int)((progress / total) * 100) + 50)), false);
            const CKey& key = std::get<0>(key_tuple);
            int64_t time = std::get<1>(key_tuple);
            bool has_label = std::get<2>(key_tuple);
            std::string label = std::get<3>(key_tuple);

            CPubKey pubkey = key.GetPubKey();
            CHECK_NONFATAL(key.VerifyPubKey(pubkey));
            CKeyID keyid = pubkey.GetID();

            pwallet->WalletLogPrintf("Importing %s...\n", EncodeDestination(PKHash(keyid)));

            if (!pwallet->ImportPrivKeys({{keyid, key}}, time)) {
                pwallet->WalletLogPrintf("Error importing key for %s\n", EncodeDestination(PKHash(keyid)));
                fGood = false;
                continue;
            }

            if (has_label)
                pwallet->SetAddressBook(PKHash(keyid), label, AddressPurpose::RECEIVE);
            progress++;
        }
        for (const auto& script_pair : scripts) {
            pwallet->chain().showProgress("", std::max(50, std::min(75, (int)((progress / total) * 100) + 50)), false);
            const CScript& script = script_pair.first;
            int64_t time = script_pair.second;

            if (!pwallet->ImportScripts({script}, time)) {
                pwallet->WalletLogPrintf("Error importing script %s\n", HexStr(script));
                fGood = false;
                continue;
            }

            progress++;
        }
        pwallet->chain().showProgress("", 100, false); // hide progress dialog in GUI
    }
    pwallet->chain().showProgress("", 100, false); // hide progress dialog in GUI
    RescanWallet(*pwallet, reserver, nTimeBegin, /*update=*/false);
    pwallet->MarkDirty();

    if (!fGood)
        throw JSONRPCError(RPC_WALLET_ERROR, "Error adding some keys/scripts to wallet");

    return UniValue::VNULL;
},
    };
}